

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O2

void __thiscall ValidateVulnerability::StoreLine(ValidateVulnerability *this)

{
  Validate *__s;
  int *piVar1;
  int iVar2;
  size_t sVar3;
  
  piVar1 = &(this->super_Validate).lineno_;
  *piVar1 = *piVar1 + 1;
  iVar2 = (this->v_).intensity_bin_id;
  this->prevVulID_ = (this->v_).vulnerability_id;
  this->prevIntBinID_ = iVar2;
  iVar2 = (this->v_).damage_bin_id;
  this->prevDamageBinID_ = iVar2;
  if (this->maxDamageBin_ < iVar2) {
    this->maxDamageBin_ = iVar2;
  }
  __s = &this->super_Validate;
  sVar3 = strlen(__s->line_);
  memcpy(this->prevLine_,__s,sVar3 + 1);
  sVar3 = strlen(__s->line_);
  this->prevLine_[sVar3 - 1] = '\0';
  return;
}

Assistant:

inline void ValidateVulnerability::StoreLine() {
/* Store current line before going to the next one. Used in some error message
 * output. */

    ++lineno_;
    prevVulID_ = v_.vulnerability_id;
    prevIntBinID_ = v_.intensity_bin_id;
    prevDamageBinID_ = v_.damage_bin_id;
    if (v_.damage_bin_id > maxDamageBin_) {
      // Maximum damage bin index is a required argument to convert
      // vulnerability csv files to binary format with vulnerabilitytobin
      maxDamageBin_ = v_.damage_bin_id;
    }
    memcpy(prevLine_, line_, strlen(line_) + 1);
    prevLine_[strlen(line_) - 1] = '\0';

}